

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int32_t iVar33;
  fpclass_type fVar34;
  int32_t iVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  IdxElement *pIVar39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar40;
  long lVar41;
  fpclass_type *pfVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  long lVar46;
  uint uVar47;
  type t;
  cpp_dec_float<100U,_int,_void> local_4c0;
  IdxElement local_470;
  IdxElement local_41c;
  IdxElement local_3c8;
  IdxElement local_374;
  IdxElement local_320;
  IdxElement local_2cc;
  cpp_dec_float<100U,_int,_void> local_278;
  IdxElement local_228;
  IdxElement local_1d4;
  IdxElement local_180;
  IdxElement local_12c;
  IdxElement local_d8;
  IdxElement local_84;
  
  if (start + 1 < end) {
    uVar44 = end - 1;
    uVar36 = uVar44 - start;
    if (0x18 < (int)uVar36) {
LAB_004687fb:
      iVar37 = (uVar36 >> 1) + start;
      pIVar1 = keys + iVar37;
      pIVar39 = keys + iVar37;
      pnVar40 = &pIVar39->val;
      iVar37 = pIVar39->idx;
      uVar10 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xc);
      uVar11 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xe);
      uVar12 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 8);
      uVar13 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 10);
      uVar14 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)(pnVar40->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 2);
      iVar6 = (pIVar39->val).m_backend.exp;
      bVar4 = (pIVar39->val).m_backend.neg;
      fVar7 = (pIVar39->val).m_backend.fpclass;
      iVar8 = (pIVar39->val).m_backend.prec_elem;
      lVar41 = (long)start;
      uVar36 = uVar44;
      uVar47 = start;
      do {
        uVar43 = (ulong)uVar36;
        if ((type & 1U) == 0) {
          if ((int)uVar47 < (int)uVar44) {
            pfVar42 = &keys[(int)uVar47].val.m_backend.fpclass;
            do {
              local_12c.idx = pfVar42[-0x13];
              local_12c.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
              local_12c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
              local_12c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
              local_12c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
              local_12c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
              local_12c.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
              local_12c.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
              local_12c.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
              local_12c.val.m_backend.exp = pfVar42[-2];
              local_12c.val.m_backend.neg = *(bool *)(pfVar42 + -1);
              local_12c.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
              local_374.idx = iVar37;
              local_374.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_374.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_374.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_374.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_374.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_374.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_374.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_374.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_374.val.m_backend.exp = iVar6;
              local_374.val.m_backend.neg = bVar4;
              local_374.val.m_backend.fpclass = fVar7;
              local_374.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_12c,&local_374);
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (0 < iVar38) break;
              uVar47 = uVar47 + 1;
              pfVar42 = pfVar42 + 0x15;
            } while (uVar44 != uVar47);
          }
          if (start < (int)uVar36) {
            uVar43 = (ulong)(int)uVar36;
            pfVar42 = &keys[uVar43].val.m_backend.fpclass;
            do {
              local_180.idx = pfVar42[-0x13];
              local_180.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
              local_180.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
              local_180.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
              local_180.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
              local_180.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
              local_180.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
              local_180.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
              local_180.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
              local_180.val.m_backend.exp = pfVar42[-2];
              local_180.val.m_backend.neg = *(bool *)(pfVar42 + -1);
              local_180.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
              local_3c8.idx = iVar37;
              local_3c8.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_3c8.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_3c8.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_3c8.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_3c8.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_3c8.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_3c8.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_3c8.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_3c8.val.m_backend.exp = iVar6;
              local_3c8.val.m_backend.neg = bVar4;
              local_3c8.val.m_backend.fpclass = fVar7;
              local_3c8.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_180,&local_3c8);
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (iVar38 < 1) break;
              uVar43 = uVar43 - 1;
              pfVar42 = pfVar42 + -0x15;
            } while (lVar41 < (long)uVar43);
          }
        }
        else {
          if ((int)uVar47 < (int)uVar44) {
            pfVar42 = &keys[(int)uVar47].val.m_backend.fpclass;
            lVar46 = 0;
            do {
              local_84.idx = pfVar42[-0x13];
              local_84.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
              local_84.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
              local_84.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
              local_84.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
              local_84.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
              local_84.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
              local_84.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
              local_84.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
              local_84.val.m_backend.exp = pfVar42[-2];
              local_84.val.m_backend.neg = *(bool *)(pfVar42 + -1);
              local_84.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
              local_2cc.idx = iVar37;
              local_2cc.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_2cc.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_2cc.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_2cc.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_2cc.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_2cc.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_2cc.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_2cc.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_2cc.val.m_backend.exp = iVar6;
              local_2cc.val.m_backend.neg = bVar4;
              local_2cc.val.m_backend.fpclass = fVar7;
              local_2cc.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_84,&local_2cc);
              if (local_4c0.fpclass == cpp_dec_float_NaN) {
                uVar47 = uVar47 - (int)lVar46;
                goto LAB_00468bb4;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (-1 < iVar38) {
                uVar47 = uVar47 - (int)lVar46;
                goto LAB_00468bb4;
              }
              lVar46 = lVar46 + -1;
              pfVar42 = pfVar42 + 0x15;
            } while ((long)(int)uVar47 - (long)(int)uVar44 != lVar46);
            uVar47 = uVar47 - (int)lVar46;
          }
LAB_00468bb4:
          if (start < (int)uVar36) {
            uVar43 = (ulong)(int)uVar36;
            pfVar42 = &keys[uVar43].val.m_backend.fpclass;
            do {
              local_d8.idx = pfVar42[-0x13];
              local_d8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
              local_d8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
              local_d8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
              local_d8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
              local_d8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
              local_d8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
              local_d8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
              local_d8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
              local_d8.val.m_backend.exp = pfVar42[-2];
              local_d8.val.m_backend.neg = *(bool *)(pfVar42 + -1);
              local_d8.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
              local_320.idx = iVar37;
              local_320.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_320.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_320.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_320.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_320.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_320.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_320.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_320.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_320.val.m_backend.exp = iVar6;
              local_320.val.m_backend.neg = bVar4;
              local_320.val.m_backend.fpclass = fVar7;
              local_320.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_d8,&local_320);
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (iVar38 < 0) break;
              uVar43 = uVar43 - 1;
              pfVar42 = pfVar42 + -0x15;
            } while (lVar41 < (long)uVar43);
          }
        }
        uVar36 = (uint)uVar43;
        if ((int)uVar36 <= (int)uVar47) goto LAB_00468f75;
        iVar38 = keys[(int)uVar47].idx;
        puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 0xc;
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 8;
        uVar20 = *(undefined8 *)puVar2;
        uVar21 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 4;
        uVar22 = *(undefined8 *)puVar2;
        uVar23 = *(undefined8 *)(puVar2 + 2);
        uVar24 = *(undefined8 *)keys[(int)uVar47].val.m_backend.data._M_elems;
        uVar25 = *(undefined8 *)(keys[(int)uVar47].val.m_backend.data._M_elems + 2);
        iVar9 = keys[(int)uVar47].val.m_backend.exp;
        bVar5 = keys[(int)uVar47].val.m_backend.neg;
        keys[(int)uVar47].idx = keys[(int)uVar36].idx;
        uVar26 = *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems;
        uVar27 = *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2);
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
        uVar28 = *(undefined8 *)puVar2;
        uVar29 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 8;
        uVar30 = *(undefined8 *)puVar2;
        uVar31 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 0xc;
        uVar32 = *(undefined8 *)(puVar2 + 2);
        puVar3 = keys[(int)uVar47].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
        *(undefined8 *)(puVar3 + 2) = uVar32;
        puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar30;
        *(undefined8 *)(puVar2 + 2) = uVar31;
        puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar28;
        *(undefined8 *)(puVar2 + 2) = uVar29;
        *(undefined8 *)keys[(int)uVar47].val.m_backend.data._M_elems = uVar26;
        *(undefined8 *)(keys[(int)uVar47].val.m_backend.data._M_elems + 2) = uVar27;
        keys[(int)uVar47].val.m_backend.exp = keys[(int)uVar36].val.m_backend.exp;
        keys[(int)uVar47].val.m_backend.neg = keys[(int)uVar36].val.m_backend.neg;
        keys[(int)uVar36].idx = iVar38;
        *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems = uVar24;
        *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2) = uVar25;
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar22;
        *(undefined8 *)(puVar2 + 2) = uVar23;
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar20;
        *(undefined8 *)(puVar2 + 2) = uVar21;
        puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar18;
        *(undefined8 *)(puVar2 + 2) = uVar19;
        keys[(int)uVar36].val.m_backend.exp = iVar9;
        keys[(int)uVar36].val.m_backend.neg = bVar5;
        fVar34 = keys[(int)uVar47].val.m_backend.fpclass;
        iVar35 = keys[(int)uVar47].val.m_backend.prec_elem;
        iVar33 = keys[(int)uVar36].val.m_backend.prec_elem;
        keys[(int)uVar47].val.m_backend.fpclass = keys[(int)uVar36].val.m_backend.fpclass;
        keys[(int)uVar47].val.m_backend.prec_elem = iVar33;
        keys[(int)uVar36].val.m_backend.fpclass = fVar34;
        keys[(int)uVar36].val.m_backend.prec_elem = iVar35;
        uVar47 = uVar47 + 1;
        uVar36 = uVar36 - 1;
      } while( true );
    }
LAB_00469475:
    if (0 < (int)uVar36) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar44,compare,start);
    }
  }
  return;
LAB_00468f75:
  if ((type & 1U) == 0) {
    if (start < (int)uVar36) {
      uVar43 = (ulong)(int)uVar36;
      pfVar42 = &keys[uVar43].val.m_backend.fpclass;
      do {
        local_228.idx = pfVar42[-0x13];
        local_228.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
        local_228.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
        local_228.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
        local_228.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
        local_228.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
        local_228.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
        local_228.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
        local_228.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
        local_228.val.m_backend.exp = pfVar42[-2];
        local_228.val.m_backend.neg = *(bool *)(pfVar42 + -1);
        local_228.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
        local_470.idx = iVar37;
        local_470.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_470.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_470.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_470.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_470.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_470.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_470.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_470.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_470.val.m_backend.exp = iVar6;
        local_470.val.m_backend.neg = bVar4;
        local_470.val.m_backend.fpclass = fVar7;
        local_470.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_470,&local_228);
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_278,0,(type *)0x0);
        iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&local_278);
        if (0 < iVar38) break;
        uVar43 = uVar43 - 1;
        pfVar42 = pfVar42 + -0x15;
      } while (lVar41 < (long)uVar43);
    }
    uVar36 = (uint)uVar43;
    if (uVar36 == uVar44) {
      iVar37 = keys[(int)uVar36].idx;
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2);
      iVar6 = keys[(int)uVar36].val.m_backend.exp;
      bVar4 = keys[(int)uVar36].val.m_backend.neg;
      keys[(int)uVar36].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar40->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2) = uVar19;
      keys[(int)uVar36].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar36].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar37;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar40->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[(int)uVar36].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar36].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar36].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar36].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar36 = uVar36 - 1;
    }
  }
  else {
    if ((int)uVar47 < (int)uVar44) {
      pfVar42 = &keys[(int)uVar47].val.m_backend.fpclass;
      do {
        local_1d4.idx = pfVar42[-0x13];
        local_1d4.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar42 + -0x12))->data)._M_elems;
        local_1d4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar42 + -0x10);
        local_1d4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar42 + -0xe);
        local_1d4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar42 + -0xc);
        local_1d4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar42 + -10);
        local_1d4.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar42 + -8);
        local_1d4.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar42 + -6);
        local_1d4.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar42 + -4);
        local_1d4.val.m_backend.exp = pfVar42[-2];
        local_1d4.val.m_backend.neg = *(bool *)(pfVar42 + -1);
        local_1d4.val.m_backend._72_8_ = *(undefined8 *)pfVar42;
        local_41c.idx = iVar37;
        local_41c.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_41c.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_41c.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_41c.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_41c.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_41c.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_41c.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_41c.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_41c.val.m_backend.exp = iVar6;
        local_41c.val.m_backend.neg = bVar4;
        local_41c.val.m_backend.fpclass = fVar7;
        local_41c.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_41c,&local_1d4);
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_278,0,(type *)0x0);
        iVar38 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&local_278);
        if (iVar38 < 0) break;
        uVar47 = uVar47 + 1;
        pfVar42 = pfVar42 + 0x15;
      } while (uVar44 != uVar47);
    }
    if (uVar47 == start) {
      iVar37 = keys[(int)uVar47].idx;
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[(int)uVar47].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[(int)uVar47].val.m_backend.data._M_elems + 2);
      iVar6 = keys[(int)uVar47].val.m_backend.exp;
      bVar4 = keys[(int)uVar47].val.m_backend.neg;
      keys[(int)uVar47].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar40->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[(int)uVar47].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[(int)uVar47].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[(int)uVar47].val.m_backend.data._M_elems + 2) = uVar19;
      keys[(int)uVar47].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar47].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar37;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar40->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar39->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[(int)uVar47].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar47].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar47].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar47].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar47 = uVar47 + 1;
    }
  }
  if ((int)(uVar44 - uVar47) < (int)(uVar36 - start)) {
    bVar4 = (int)uVar44 <= (int)uVar47;
    uVar45 = uVar36;
    uVar36 = uVar44;
    uVar44 = uVar47;
    uVar47 = start;
    if (bVar4) goto LAB_00469454;
  }
  else {
    bVar4 = (int)uVar36 <= start;
    uVar45 = uVar44;
    uVar44 = start;
    start = uVar47;
    if (bVar4) goto LAB_00469454;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar36 + 1,compare,uVar44,(bool)(~type & 1));
  start = uVar47;
LAB_00469454:
  uVar44 = uVar45;
  type = (bool)(type ^ 1);
  uVar36 = uVar44 - start;
  if ((int)uVar36 < 0x19) goto LAB_00469475;
  goto LAB_004687fb;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}